

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O3

bool __thiscall LEFReader::parseClass(LEFReader *this)

{
  token_t tVar1;
  bool bVar2;
  string className;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  tVar1 = tokenize(this,&this->m_tokstr);
  this->m_curtok = tVar1;
  if (tVar1 == TOK_IDENT) {
    do {
      std::__cxx11::string::_M_append((char *)&local_50,(ulong)(this->m_tokstr)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_50);
      tVar1 = tokenize(this,&this->m_tokstr);
      this->m_curtok = tVar1;
    } while (tVar1 == TOK_IDENT);
    if (tVar1 == TOK_SEMICOL) {
      bVar2 = true;
      (*this->_vptr_LEFReader[3])(this,&local_50);
      goto LAB_0012c0f9;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Expected a semicolon\n","")
    ;
    error(this,&local_70);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Expected at least one class\n","");
    error(this,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_0012c0f9:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return bVar2;
}

Assistant:

bool LEFReader::parseClass()
{
    // CLASS name <optional name> ';'

    std::string className;
    

    // read in all the classes
    bool foundOne = false;
    m_curtok = tokenize(m_tokstr);
    while(m_curtok == TOK_IDENT)
    {
        foundOne = true;
        className += m_tokstr;
        className += " ";
        m_curtok = tokenize(m_tokstr);
    }
    if (!foundOne)
    {
        error("Expected at least one class\n");
        return false;
    }
    
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon\n");
        return false;
    }

    onClass(className);

    return true;
}